

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O0

image * __thiscall basisu::image::operator=(image *this,image *rhs)

{
  image *in_RSI;
  image *in_RDI;
  
  if (in_RDI != in_RSI) {
    in_RDI->m_width = in_RSI->m_width;
    in_RDI->m_height = in_RSI->m_height;
    in_RDI->m_pitch = in_RSI->m_pitch;
    vector<basisu::color_rgba>::operator=
              ((vector<basisu::color_rgba> *)in_RDI,(vector<basisu::color_rgba> *)in_RSI);
  }
  return in_RDI;
}

Assistant:

image &operator= (const image &rhs)
		{
			if (this != &rhs)
			{
				m_width = rhs.m_width;
				m_height = rhs.m_height;
				m_pitch = rhs.m_pitch;
				m_pixels = rhs.m_pixels;
			}
			return *this;
		}